

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_tri_node_angle(REF_NODE ref_node,REF_INT *nodes,REF_INT node,REF_DBL *angle)

{
  int iVar1;
  REF_DBL *pRVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  double dVar7;
  REF_DBL edge2 [3];
  REF_DBL edge1 [3];
  double local_58 [4];
  double local_38 [4];
  
  *angle = -9.0;
  iVar1 = *nodes;
  iVar3 = -1;
  iVar5 = -1;
  if (iVar1 == node) {
    iVar5 = nodes[1];
    iVar3 = nodes[2];
  }
  if (nodes[1] == node) {
    iVar5 = nodes[2];
    iVar3 = iVar1;
  }
  if (nodes[2] == node) {
    iVar5 = iVar1;
    iVar3 = nodes[1];
  }
  uVar4 = 5;
  if ((iVar5 != -1) && (iVar3 != -1)) {
    pRVar2 = ref_node->real;
    lVar6 = 0;
    do {
      local_38[lVar6] = pRVar2[iVar5 * 0xf + lVar6] - pRVar2[node * 0xf + lVar6];
      local_58[lVar6] = pRVar2[iVar3 * 0xf + lVar6] - pRVar2[node * 0xf + lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    uVar4 = ref_math_normalize(local_38);
    if (uVar4 == 0) {
      uVar4 = ref_math_normalize(local_58);
      if (uVar4 == 0) {
        dVar7 = acos(local_38[2] * local_58[2] +
                     local_38[0] * local_58[0] + local_38[1] * local_58[1]);
        *angle = dVar7;
        uVar4 = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x926,"ref_node_tri_node_angle",(ulong)uVar4,"normalize zero length edge2");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x925,
             "ref_node_tri_node_angle",(ulong)uVar4,"normalize zero length edge1");
    }
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_node_angle(REF_NODE ref_node, REF_INT *nodes,
                                           REF_INT node, REF_DBL *angle) {
  REF_INT node1, node2, i;
  REF_DBL edge1[3], edge2[3];

  *angle = -9.0;

  node1 = REF_EMPTY;
  node2 = REF_EMPTY;
  if (node == nodes[0]) {
    node1 = nodes[1];
    node2 = nodes[2];
  }
  if (node == nodes[1]) {
    node1 = nodes[2];
    node2 = nodes[0];
  }
  if (node == nodes[2]) {
    node1 = nodes[0];
    node2 = nodes[1];
  }
  if (REF_EMPTY == node1 || REF_EMPTY == node2) return REF_NOT_FOUND;

  for (i = 0; i < 3; i++) {
    edge1[i] =
        ref_node_xyz(ref_node, i, node1) - ref_node_xyz(ref_node, i, node);
    edge2[i] =
        ref_node_xyz(ref_node, i, node2) - ref_node_xyz(ref_node, i, node);
  }

  RSS(ref_math_normalize(edge1), "normalize zero length edge1");
  RSS(ref_math_normalize(edge2), "normalize zero length edge2");
  *angle = acos(ref_math_dot(edge1, edge2));

  return REF_SUCCESS;
}